

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall Potassco::Application::onUnhandledException(Application *this)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined1 auVar3 [12];
  
  auVar3 = __cxa_rethrow();
  plVar1 = (long *)__cxa_begin_catch(auVar3._0_8_);
  if (auVar3._8_4_ == 2) {
    uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
    (*this->_vptr_Application[6])(this,uVar2);
  }
  else {
    (*this->_vptr_Application[6])(this,"Unknown exception");
  }
  __cxa_end_catch();
  exit(this,1);
  __cxa_end_catch();
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Application::onUnhandledException() {
	try { throw; }
	catch (const std::exception& e) { error(e.what()); }
	catch (...)                     { error("Unknown exception"); }
	exit(EXIT_FAILURE);
}